

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mipmapped_texture::read_ktx(mipmapped_texture *this,data_stream_serializer *serializer)

{
  dynamic_string *this_00;
  face_vec *this_01;
  color_quad<unsigned_char,_int> *pcVar1;
  uint32 new_size;
  bool bVar2;
  bool bVar3;
  uint new_size_00;
  pixel_format pVar4;
  uint uVar5;
  component_flags cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  mip_level *this_02;
  dxt_image *this_03;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  uchar *p_00;
  ulong uVar12;
  int i;
  uint uVar13;
  char *p_01;
  uint uVar14;
  uint *init1;
  pixel_format pVar15;
  dxt_format dxt_fmt;
  orientation_flags_t oVar16;
  char *ctx;
  char *ctx_00;
  uint x;
  uint uVar17;
  ulong uVar18;
  uint y;
  vector<unsigned_char> *pvVar19;
  uint height;
  uint width;
  color_quad_u8 c;
  orientation_flags_t local_158;
  int local_140;
  dynamic_string orient;
  dynamic_string crnlib_fourcc_str;
  pixel_packer unpacker;
  ktx_texture kt;
  
  clear(this);
  this_00 = &this->m_last_error;
  dynamic_string::operator=(this_00,"Unable to read KTX file");
  ktx_texture::ktx_texture(&kt);
  bVar2 = ktx_texture::read_from_stream(&kt,serializer);
  new_size = kt.m_header.m_numberOfFaces;
  if (!bVar2) {
LAB_00123e2e:
    bVar2 = false;
    goto LAB_00123e30;
  }
  if ((1 < kt.m_header.m_pixelDepth) || (1 < kt.m_header.m_numberOfArrayElements)) {
    dynamic_string::operator=(this_00,"read_ktx: Depth and array textures are not supported");
    goto LAB_00123e2e;
  }
  this->m_width = kt.m_header.m_pixelWidth;
  this->m_height = kt.m_header.m_pixelHeight + (kt.m_header.m_pixelHeight == 0);
  new_size_00 = kt.m_header.m_numberOfMipmapLevels + (kt.m_header.m_numberOfMipmapLevels == 0);
  crnlib_fourcc_str.m_buf_size = 0;
  crnlib_fourcc_str.m_len = 0;
  uVar10 = (ulong)kt.m_header.m_numberOfFaces;
  crnlib_fourcc_str.m_pStr = (char *)0x0;
  bVar2 = ktx_texture::get_key_value_as_string(&kt,"CRNLIB_FOURCC",&crnlib_fourcc_str);
  pVar15 = PIXEL_FMT_INVALID;
  if (bVar2 && crnlib_fourcc_str.m_len == 4) {
    pcVar11 = crnlib_fourcc_str.m_pStr;
    if (crnlib_fourcc_str.m_pStr == (char *)0x0) {
      pcVar11 = "";
    }
    pVar15 = PIXEL_FMT_INVALID;
    for (uVar13 = 3; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
      pVar15 = pVar15 << 8 | (int)pcVar11[uVar13];
    }
  }
  unpacker.m_comp_max[2] = 0;
  unpacker.m_comp_max[3] = 0;
  unpacker.m_rgb_is_luma = false;
  unpacker._57_3_ = 0;
  unpacker.m_comp_ofs[2] = 0;
  unpacker.m_comp_ofs[3] = 0;
  unpacker.m_comp_max[0] = 0;
  unpacker.m_comp_max[1] = 0;
  unpacker.m_comp_size[2] = 0;
  unpacker.m_comp_size[3] = 0;
  unpacker.m_comp_ofs[0] = 0;
  unpacker.m_comp_ofs[1] = 0;
  unpacker.m_pixel_stride = 0;
  unpacker.m_num_comps = 0;
  unpacker.m_comp_size[0] = 0;
  unpacker.m_comp_size[1] = 0;
  if (1 < kt.m_block_dim) {
    dxt_fmt = cDXT5;
    uVar13 = kt.m_header.m_glInternalFormat - 0x83a0;
    if (uVar13 < 6) {
      if ((3U >> (uVar13 & 0x1f) & 1) != 0) goto switchD_001240ef_caseD_8c4c;
      if ((0xcU >> (uVar13 & 0x1f) & 1) != 0) goto switchD_001240ef_caseD_8c4e;
      goto switchD_001240ef_caseD_8c4f;
    }
    switch(kt.m_header.m_glInternalFormat) {
    case 0x83f0:
switchD_001240ef_caseD_8c4c:
      dxt_fmt = cDXT1;
      break;
    case 0x83f1:
switchD_001240ef_caseD_8c4d:
      dxt_fmt = cDXT1A;
      break;
    case 0x83f2:
switchD_001240ef_caseD_8c4e:
      dxt_fmt = cDXT3;
      break;
    case 0x83f3:
      break;
    default:
      switch(kt.m_header.m_glInternalFormat) {
      case 0x8c4c:
        goto switchD_001240ef_caseD_8c4c;
      case 0x8c4d:
        goto switchD_001240ef_caseD_8c4d;
      case 0x8c4e:
        goto switchD_001240ef_caseD_8c4e;
      case 0x8c4f:
        goto switchD_001240ef_caseD_8c4f;
      default:
        if (kt.m_header.m_glInternalFormat == 0x8c70) {
          dxt_fmt = cDXT5A;
          goto switchD_001240ef_caseD_8c4f;
        }
        if (kt.m_header.m_glInternalFormat == 0x8d64) {
          dxt_fmt = cETC1;
          goto switchD_001240ef_caseD_8c4f;
        }
        if (kt.m_header.m_glInternalFormat == 0x8dbe) {
          dxt_fmt = (uint)(pVar15 != PIXEL_FMT_DXN) + cDXN_XY;
          goto switchD_001240ef_caseD_8c4f;
        }
        if (kt.m_header.m_glInternalFormat == 0x9274) {
          dxt_fmt = cETC2;
          goto switchD_001240ef_caseD_8c4f;
        }
        if (kt.m_header.m_glInternalFormat == 0x9278) {
          dxt_fmt = cETC2A;
          goto switchD_001240ef_caseD_8c4f;
        }
        pcVar11 = "Unsupported KTX internal format";
      }
      goto LAB_0012421e;
    }
switchD_001240ef_caseD_8c4f:
    pVar4 = pixel_format_helpers::from_dxt_format(dxt_fmt);
    this->m_format = pVar4;
    if (pVar4 != PIXEL_FMT_INVALID) {
      if (((((pVar15 == PIXEL_FMT_DXT5_AGBR) || (pVar15 == PIXEL_FMT_DXT5_xGBR)) ||
           (pVar15 == PIXEL_FMT_DXT5_CCxY)) || (pVar15 == PIXEL_FMT_DXT5_xGxR)) &&
         (dxt_fmt == cDXT5)) {
        this->m_format = pVar15;
        dxt_fmt = cDXT5;
      }
      goto LAB_00124350;
    }
    pcVar11 = "Unsupported KTX internal compressed format";
LAB_0012421e:
    dynamic_string::operator=(this_00,pcVar11);
LAB_00124226:
    bVar2 = false;
    goto LAB_001246d5;
  }
  this->m_format = PIXEL_FMT_A8R8G8B8;
  get_ogl_type_size(kt.m_header.m_glType);
  bVar2 = is_packed_pixel_ogl_type(kt.m_header.m_glType);
  dxt_fmt = cDXTInvalid;
  if (!bVar2) {
    ctx = "RGBA";
    pcVar11 = "R";
    switch(kt.m_header.m_glFormat) {
    case 0x1903:
      break;
    case 0x1904:
switchD_0012413d_caseD_8d95:
      pcVar11 = "G";
      break;
    case 0x1905:
switchD_0012413d_caseD_8d96:
      pcVar11 = "B";
      break;
    case 0x1906:
      pVar15 = PIXEL_FMT_A8;
      pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)0x186ab9);
      goto LAB_00124331;
    case 0x1907:
      goto switchD_0012419a_caseD_3;
    case 0x1908:
      goto switchD_0012419a_caseD_4;
    case 0x1909:
      pVar15 = PIXEL_FMT_L8;
      pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)0x186acb);
      goto LAB_00124331;
    case 0x190a:
      ctx_00 = "YA";
switchD_0012419a_caseD_2:
      pVar15 = PIXEL_FMT_A8L8;
      pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)ctx_00);
      goto LAB_00124331;
    default:
      p_01 = "Unsupported KTX pixel format";
      switch(kt.m_header.m_glFormat) {
      case 0x8d94:
        break;
      case 0x8d95:
        goto switchD_0012413d_caseD_8d95;
      case 0x8d96:
        goto switchD_0012413d_caseD_8d96;
      case 0x8d97:
switchD_0012413d_caseD_8d97:
        dynamic_string::operator=(this_00,p_01);
        goto LAB_00124226;
      case 0x8d99:
        goto switchD_0012419a_caseD_4;
      case 0x8d9a:
switchD_0012413d_caseD_8d9a:
        pcVar11 = "BGR";
        break;
      case 0x8d9b:
switchD_0012413d_caseD_8d9b:
        ctx = "BGRA";
        goto switchD_0012419a_caseD_4;
      default:
        ctx_00 = "RG";
        uVar13 = kt.m_header.m_glFormat - 0x8227;
        if (uVar13 < 0xc) {
          if ((0x13U >> (uVar13 & 0x1f) & 1) != 0) goto switchD_0012419a_caseD_2;
          if ((0x804U >> (uVar13 & 0x1f) & 1) != 0) break;
        }
        switch(kt.m_header.m_glFormat) {
        case 1:
          goto switchD_0012419a_caseD_1;
        case 2:
          goto switchD_0012419a_caseD_2;
        case 3:
          break;
        case 4:
          goto switchD_0012419a_caseD_4;
        default:
          if (1 < kt.m_header.m_glFormat - 0x8c40) {
            if (1 < kt.m_header.m_glFormat - 0x8c42) {
              if (kt.m_header.m_glFormat == 0x8051) break;
              if (kt.m_header.m_glFormat != 0x8058) {
                if (kt.m_header.m_glFormat == 0x80e0) goto switchD_0012413d_caseD_8d9a;
                if (kt.m_header.m_glFormat == 0x80e1) goto switchD_0012413d_caseD_8d9b;
                goto switchD_0012413d_caseD_8d97;
              }
            }
            goto switchD_0012419a_caseD_4;
          }
        }
      case 0x8d98:
switchD_0012419a_caseD_3:
        pcVar11 = "RGB";
      }
    }
switchD_0012419a_caseD_1:
    pVar15 = PIXEL_FMT_R8G8B8;
    pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)pcVar11);
LAB_00124331:
    this->m_format = pVar15;
LAB_00124336:
    uVar9 = unpacker.m_num_comps;
    uVar5 = get_ogl_type_size(kt.m_header.m_glType);
    unpacker.m_pixel_stride = uVar5 * uVar9;
    goto LAB_00124350;
  }
  switch(kt.m_header.m_glType) {
  case 0x8362:
    pcVar11 = "R3G3B2";
    goto LAB_00124275;
  case 0x8363:
    pcVar11 = "B5G6R5";
    goto LAB_00124275;
  case 0x8364:
    pcVar11 = "R5G6B5";
LAB_00124275:
    pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)pcVar11);
    this->m_format = PIXEL_FMT_R8G8B8;
    goto LAB_001242c0;
  case 0x8365:
    pcVar11 = "R4G4B4A4";
    break;
  case 0x8366:
    pcVar11 = "R5G5B5A1";
    break;
  case 0x8367:
    pcVar11 = "R8G8B8A8";
    break;
  case 0x8368:
    pcVar11 = "R10G10B10A2";
    break;
  default:
    switch(kt.m_header.m_glType) {
    case 0x8032:
      pcVar11 = "B2G3R3";
      goto LAB_00124275;
    case 0x8033:
      pcVar11 = "A4B4G4R4";
      break;
    case 0x8034:
      pcVar11 = "A1B5G5R5";
      break;
    case 0x8035:
      pcVar11 = "A8B8G8R8";
      break;
    case 0x8036:
      pcVar11 = "A2B10G10R10";
      break;
    default:
      if (kt.m_header.m_glType != 0x8c3e) {
        p_01 = "Unsupported KTX packed pixel type";
        goto switchD_0012413d_caseD_8d97;
      }
      pcVar11 = "R9G9B9A5";
    }
  }
  pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)pcVar11);
LAB_001242c0:
  dxt_fmt = cDXTInvalid;
  uVar9 = get_ogl_type_size(kt.m_header.m_glType);
  unpacker.m_pixel_stride = uVar9;
LAB_00124350:
  cVar6 = pixel_format_helpers::get_component_flags(this->m_format);
  this->m_comp_flags = cVar6;
  this_01 = &this->m_faces;
  vector<crnlib::vector<crnlib::mip_level_*>_>::resize(this_01,new_size,false);
  orient.m_buf_size = 0;
  orient.m_len = 0;
  orient.m_pStr = (char *)0x0;
  bVar2 = ktx_texture::get_key_value_as_string(&kt,"KTXorientation",&orient);
  if (bVar2 && 6 < orient.m_len) {
    pcVar11 = "";
    if (orient.m_pStr != (char *)0x0) {
      pcVar11 = orient.m_pStr;
    }
    if (((*pcVar11 != 'S') || (pcVar11[1] != '=')) ||
       ((pcVar11[3] != ',' || ((pcVar11[4] != 'T' || (pcVar11[5] != '=')))))) goto LAB_0012441d;
    iVar7 = tolower((int)pcVar11[2]);
    oVar16 = (orientation_flags_t)(iVar7 == 0x6c);
    iVar8 = tolower((int)pcVar11[6]);
    if (iVar8 == 0x75) goto LAB_0012441f;
    local_158 = (iVar7 == 0x6c) + cOrientationFlagYFlipped;
    if (iVar8 == 100) {
      local_158 = (uint)(iVar7 == 0x6c);
    }
  }
  else {
LAB_0012441d:
    oVar16 = cDefaultOrientationFlags;
LAB_0012441f:
    local_158 = oVar16 | cOrientationFlagYFlipped;
  }
  bVar3 = false;
  for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
    vector<crnlib::mip_level_*>::resize(this_01->m_p + uVar12,new_size_00,false);
    for (uVar18 = 0; uVar18 != new_size_00; uVar18 = uVar18 + 1) {
      uVar13 = this->m_width >> ((byte)uVar18 & 0x1f);
      width = uVar13 + (uVar13 == 0);
      uVar13 = this->m_height >> ((byte)uVar18 & 0x1f);
      height = uVar13 + (uVar13 == 0);
      this_02 = crnlib_new<crnlib::mip_level>();
      this_01->m_p[uVar12].m_p[uVar18] = this_02;
      local_140 = (int)uVar12;
      pvVar19 = kt.m_image_data.m_p +
                (kt.m_header.m_numberOfFaces * (int)uVar18 *
                 (kt.m_header.m_numberOfArrayElements + (kt.m_header.m_numberOfArrayElements == 0))
                + local_140) * (kt.m_header.m_pixelDepth + (kt.m_header.m_pixelDepth == 0));
      if (1 < kt.m_block_dim) {
        uVar9 = pixel_format_helpers::get_dxt_bytes_per_block(this->m_format);
        if (pvVar19->m_size == (width + 3 >> 2) * uVar9 * (height + 3 >> 2)) {
          this_03 = crnlib_new<crnlib::dxt_image>();
          iVar7 = dxt_image::init(this_03,(EVP_PKEY_CTX *)(ulong)(uint)dxt_fmt);
          if ((char)iVar7 != '\0') {
            memcpy((this_03->m_elements).m_p,pvVar19->m_p,(ulong)pvVar19->m_size);
            pVar15 = this->m_format;
            if ((pVar15 == PIXEL_FMT_DXT1) && (pVar15 = PIXEL_FMT_DXT1, bVar3 == false)) {
              bVar3 = dxt_image::has_alpha(this_03);
              pVar15 = this->m_format;
            }
            mip_level::assign(this_02,this_03,pVar15,local_158);
            goto LAB_00124699;
          }
          crnlib_delete<crnlib::dxt_image>(this_03);
        }
LAB_001246be:
        bVar2 = uVar10 <= uVar12;
        goto LAB_001246cb;
      }
      if (pvVar19->m_size != height * width * unpacker.m_pixel_stride) goto LAB_001246be;
      p = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                    ((crnlib *)&width,&height,init1);
      p->m_comp_flags = this->m_comp_flags;
      p_00 = pvVar19->m_p;
      for (uVar13 = 0; uVar13 < height; uVar13 = uVar13 + 1) {
        for (uVar17 = 0; uVar17 < width; uVar17 = uVar17 + 1) {
          p_00 = (uchar *)pixel_packer::unpack<crnlib::color_quad<unsigned_char,int>>
                                    (&unpacker,p_00,&c,true);
          pcVar1 = p->m_pPixels;
          uVar14 = p->m_pitch * uVar13 + uVar17;
          pcVar1[uVar14].field_0.field_0.r = c.field_0.field_0.r;
          pcVar1[uVar14].field_0.field_0.g = c.field_0.field_0.g;
          pcVar1[uVar14].field_0.field_0.b = c.field_0.field_0.b;
          pcVar1[uVar14].field_0.field_0.a = c.field_0.field_0.a;
        }
      }
      mip_level::assign(this_02,p,this->m_format,local_158);
LAB_00124699:
    }
  }
  dynamic_string::clear(this_00);
  bVar2 = true;
  if (bVar3 != false) {
    change_dxt1_to_dxt1a(this);
  }
LAB_001246cb:
  dynamic_string::~dynamic_string(&orient);
LAB_001246d5:
  dynamic_string::~dynamic_string(&crnlib_fourcc_str);
LAB_00123e30:
  ktx_texture::~ktx_texture(&kt);
  return bVar2;
switchD_0012419a_caseD_4:
  pixel_packer::init(&unpacker,(EVP_PKEY_CTX *)ctx);
  goto LAB_00124336;
}

Assistant:

bool mipmapped_texture::read_ktx(data_stream_serializer& serializer) {
  clear();

  set_last_error("Unable to read KTX file");

  ktx_texture kt;
  if (!kt.read_from_stream(serializer))
    return false;

  if ((kt.get_depth() > 1) || (kt.get_array_size() > 1)) {
    set_last_error("read_ktx: Depth and array textures are not supported");
    return false;
  }

  // Must be 1D, 2D, or a cubemap, with or without mipmaps.
  m_width = kt.get_width();
  m_height = kt.get_height();

  uint num_mip_levels = kt.get_num_mips();
  uint num_faces = kt.get_num_faces();

  uint32 crnlib_fourcc = 0;
  dynamic_string crnlib_fourcc_str;
  if (kt.get_key_value_as_string("CRNLIB_FOURCC", crnlib_fourcc_str)) {
    if (crnlib_fourcc_str.get_len() == 4) {
      for (int i = 3; i >= 0; i--)
        crnlib_fourcc = (crnlib_fourcc << 8) | crnlib_fourcc_str[i];
    }
  }

  const bool is_compressed_texture = kt.is_compressed();
  dxt_format dxt_fmt = cDXTInvalid;

  pixel_packer unpacker;
  if (is_compressed_texture) {
    switch (kt.get_ogl_internal_fmt()) {
      case KTX_ETC1_RGB8_OES:
        dxt_fmt = cETC1;
        break;
      case KTX_COMPRESSED_RGB8_ETC2:
        dxt_fmt = cETC2;
        break;
      case KTX_COMPRESSED_RGBA8_ETC2_EAC:
        dxt_fmt = cETC2A;
        break;
      case KTX_RGB_S3TC:
      case KTX_RGB4_S3TC:
      case KTX_COMPRESSED_RGB_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT1_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT:
        dxt_fmt = cDXT1A;
        break;
      case KTX_RGBA_S3TC:
      case KTX_RGBA4_S3TC:
      case KTX_COMPRESSED_RGBA_S3TC_DXT3_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT:
        dxt_fmt = cDXT3;
        break;
      case KTX_COMPRESSED_RGBA_S3TC_DXT5_EXT:
      case KTX_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT:
      case KTX_RGBA_DXT5_S3TC:
      case KTX_RGBA4_DXT5_S3TC:
        dxt_fmt = cDXT5;
        break;
      case KTX_COMPRESSED_SIGNED_RED_GREEN_RGTC2_EXT:
        dxt_fmt = cDXN_YX;
        if (crnlib_fourcc == PIXEL_FMT_DXN) {
          dxt_fmt = cDXN_XY;
        }
        break;
      case KTX_COMPRESSED_LUMINANCE_LATC1_EXT:
        dxt_fmt = cDXT5A;
        break;
      default:
        set_last_error("Unsupported KTX internal format");
        return false;
    }

    m_format = pixel_format_helpers::from_dxt_format(dxt_fmt);
    if (m_format == PIXEL_FMT_INVALID) {
      set_last_error("Unsupported KTX internal compressed format");
      return false;
    }

    if (crnlib_fourcc != 0) {
      switch (crnlib_fourcc) {
        case PIXEL_FMT_DXT5_CCxY:
        case PIXEL_FMT_DXT5_xGxR:
        case PIXEL_FMT_DXT5_xGBR:
        case PIXEL_FMT_DXT5_AGBR: {
          if (dxt_fmt == cDXT5) {
            m_format = static_cast<pixel_format>(crnlib_fourcc);
          }
          break;
        }
      }
    }
  } else {
    m_format = PIXEL_FMT_A8R8G8B8;
    const uint type_size = get_ogl_type_size(kt.get_ogl_type());
    const uint type_bits = type_size * 8;

    // Normal component order:   1,2,3,4 (*last* component packed into LSB of output type)
    // Reversed component order: 4,3,2,1 (*first* component packed into LSB of output type)

    if (is_packed_pixel_ogl_type(kt.get_ogl_type())) {
      switch (kt.get_ogl_type()) {
        // 24bpp packed formats
        case KTX_UNSIGNED_BYTE_3_3_2:
          unpacker.init("B2G3R3");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_BYTE_2_3_3_REV:
          unpacker.init("R3G3B2");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5:
          unpacker.init("B5G6R5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        case KTX_UNSIGNED_SHORT_5_6_5_REV:
          unpacker.init("R5G6B5");
          m_format = PIXEL_FMT_R8G8B8;
          break;
        // 32bpp packed formats
        case KTX_UNSIGNED_SHORT_4_4_4_4:
          unpacker.init("A4B4G4R4");
          break;
        case KTX_UNSIGNED_SHORT_4_4_4_4_REV:
          unpacker.init("R4G4B4A4");
          break;
        case KTX_UNSIGNED_SHORT_5_5_5_1:
          unpacker.init("A1B5G5R5");
          break;
        case KTX_UNSIGNED_SHORT_1_5_5_5_REV:
          unpacker.init("R5G5B5A1");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8:
          unpacker.init("A8B8G8R8");
          break;
        case KTX_UNSIGNED_INT_8_8_8_8_REV:
          unpacker.init("R8G8B8A8");
          break;
        case KTX_UNSIGNED_INT_10_10_10_2:
          unpacker.init("A2B10G10R10");
          break;
        case KTX_UNSIGNED_INT_2_10_10_10_REV:
          unpacker.init("R10G10B10A2");
          break;
        case KTX_UNSIGNED_INT_5_9_9_9_REV:
          unpacker.init("R9G9B9A5");
          break;
        default:
          set_last_error("Unsupported KTX packed pixel type");
          return false;
      }

      unpacker.set_pixel_stride(get_ogl_type_size(kt.get_ogl_type()));
    } else {
      switch (kt.get_ogl_fmt()) {
        case 1:
        case KTX_RED:
        case KTX_RED_INTEGER:
        case KTX_R8:
        case KTX_R8UI: {
          unpacker.init("R", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_GREEN:
        case KTX_GREEN_INTEGER: {
          unpacker.init("G", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BLUE:
        case KTX_BLUE_INTEGER: {
          unpacker.init("B", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_ALPHA: {
          unpacker.init("A", -1, type_bits);
          m_format = PIXEL_FMT_A8;
          break;
        }
        case KTX_LUMINANCE: {
          unpacker.init("Y", -1, type_bits);
          m_format = PIXEL_FMT_L8;
          break;
        }
        case 2:
        case KTX_RG:
        case KTX_RG8:
        case KTX_RG_INTEGER: {
          unpacker.init("RG", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case KTX_LUMINANCE_ALPHA: {
          unpacker.init("YA", -1, type_bits);
          m_format = PIXEL_FMT_A8L8;
          break;
        }
        case 3:
        case KTX_SRGB:
        case KTX_RGB:
        case KTX_RGB_INTEGER:
        case KTX_RGB8:
        case KTX_SRGB8: {
          unpacker.init("RGB", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case KTX_BGR:
        case KTX_BGR_INTEGER: {
          unpacker.init("BGR", -1, type_bits);
          m_format = PIXEL_FMT_R8G8B8;
          break;
        }
        case 4:
        case KTX_RGBA_INTEGER:
        case KTX_RGBA:
        case KTX_SRGB_ALPHA:
        case KTX_SRGB8_ALPHA8:
        case KTX_RGBA8: {
          unpacker.init("RGBA", -1, type_bits);
          break;
        }
        case KTX_BGRA:
        case KTX_BGRA_INTEGER: {
          unpacker.init("BGRA", -1, type_bits);
          break;
        }
        default:
          set_last_error("Unsupported KTX pixel format");
          return false;
      }

      unpacker.set_pixel_stride(unpacker.get_num_comps() * get_ogl_type_size(kt.get_ogl_type()));
    }

    CRNLIB_ASSERT(unpacker.is_valid());
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  m_faces.resize(num_faces);

  bool x_flipped = false;
  bool y_flipped = true;

  dynamic_string orient;
  if ((kt.get_key_value_as_string("KTXorientation", orient)) && (orient.get_len() >= 7)) {
    //  0123456
    // "S=r,T=d"
    if ((orient[0] == 'S') && (orient[1] == '=') && (orient[3] == ',') &&
        (orient[4] == 'T') && (orient[5] == '=')) {
      if (tolower(orient[2]) == 'l')
        x_flipped = true;
      else if (tolower(orient[2]) == 'r')
        x_flipped = false;

      if (tolower(orient[6]) == 'u')
        y_flipped = true;
      else if (tolower(orient[6]) == 'd')
        y_flipped = false;
    }
  }

  orientation_flags_t orient_flags = cDefaultOrientationFlags;
  if (x_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagXFlipped);
  if (y_flipped)
    orient_flags = static_cast<orientation_flags_t>(orient_flags | cOrientationFlagYFlipped);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(m_width >> level_index, 1U);
      const uint height = math::maximum<uint>(m_height >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      const crnlib::vector<uint8>& image_data = kt.get_image_data(level_index, 0, face_index, 0);

      if (is_compressed_texture) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        if (image_data.size() != level_pitch)
          return false;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == level_pitch);

        memcpy(&pDXTImage->get_element_vec()[0], image_data.get_ptr(), image_data.size());

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format, orient_flags);
      } else {
        if (image_data.size() != (width * height * unpacker.get_pixel_stride()))
          return false;

        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint8* pSrc = image_data.get_ptr();

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          for (uint x = 0; x < width; x++) {
            color_quad_u8 c;
            pSrc = static_cast<const uint8*>(unpacker.unpack(pSrc, c));
            pImage->set_pixel_unclipped(x, y, c);
          }
        }

        pMip->assign(pImage, m_format, orient_flags);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}